

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::train_one_against_some_at_leaf
               (memory_tree *b,single_learner *base,uint32_t cn,example *ec)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  size_t sVar5;
  uint *puVar6;
  learner<char,_example> *in_RCX;
  example *in_RSI;
  long in_RDI;
  size_t i;
  labels preds;
  labels multilabels;
  v_array<unsigned_int> leaf_labs;
  example *ec_00;
  learner<char,_example> *this;
  ulong local_98;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff7c;
  memory_tree *in_stack_ffffffffffffff80;
  undefined8 uVar7;
  v_array<unsigned_int> local_60;
  v_array<unsigned_int> local_40;
  learner<char,_example> *local_20;
  example *local_10;
  long local_8;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  v_init<unsigned_int>();
  collect_labels_from_leaf
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             (v_array<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
  ;
  local_60._begin = *(uint **)(local_20 + 0x6828);
  local_60._end = *(uint **)(local_20 + 0x6830);
  local_60.end_array = *(uint **)(local_20 + 0x6838);
  local_60.erase_count = *(size_t *)(local_20 + 0x6840);
  uVar7 = *(undefined8 *)(local_20 + 0x6850);
  uVar1 = *(undefined8 *)(local_20 + 0x6858);
  uVar2 = *(undefined8 *)(local_20 + 0x6860);
  uVar3 = *(undefined8 *)(local_20 + 0x6868);
  *(undefined8 *)(local_20 + 0x6828) = 0x3f8000007f7fffff;
  *(undefined4 *)(local_20 + 0x6830) = 0;
  for (local_98 = 0; sVar5 = v_array<unsigned_int>::size(&local_40), local_98 < sVar5;
      local_98 = local_98 + 1) {
    *(undefined4 *)(local_20 + 0x6828) = 0xbf800000;
    puVar6 = v_array<unsigned_int>::operator[](&local_40,local_98);
    bVar4 = v_array_contains<unsigned_int>(&local_60,*puVar6);
    if (bVar4) {
      *(undefined4 *)(local_20 + 0x6828) = 0x3f800000;
    }
    sVar5 = *(long *)(local_8 + 0x60) + 1;
    ec_00 = local_10;
    this = local_20;
    v_array<unsigned_int>::operator[](&local_40,local_98);
    LEARNER::learner<char,_example>::learn(this,ec_00,sVar5);
  }
  *(undefined8 *)(local_20 + 0x6850) = uVar7;
  *(undefined8 *)(local_20 + 0x6858) = uVar1;
  *(undefined8 *)(local_20 + 0x6860) = uVar2;
  *(undefined8 *)(local_20 + 0x6868) = uVar3;
  *(uint **)(local_20 + 0x6828) = local_60._begin;
  *(uint **)(local_20 + 0x6830) = local_60._end;
  *(uint **)(local_20 + 0x6838) = local_60.end_array;
  *(size_t *)(local_20 + 0x6840) = local_60.erase_count;
  return;
}

Assistant:

inline void train_one_against_some_at_leaf(memory_tree& b, single_learner& base, const uint32_t cn, example& ec){
        v_array<uint32_t> leaf_labs = v_init<uint32_t>();
        collect_labels_from_leaf(b, cn, leaf_labs); //unique labels from the leaf.
        MULTILABEL::labels multilabels = ec.l.multilabels;
        MULTILABEL::labels preds = ec.pred.multilabels;
        ec.l.simple = {FLT_MAX, 1.f, 0.f};
        for (size_t i = 0; i < leaf_labs.size(); i++){
            ec.l.simple.label = -1.f;
            if (v_array_contains(multilabels.label_v, leaf_labs[i]))
                ec.l.simple.label = 1.f;
            base.learn(ec, b.max_routers + 1 + leaf_labs[i]);
        }
        ec.pred.multilabels = preds;
        ec.l.multilabels = multilabels;
    }